

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

char * toml::Value::typeToString(Type type)

{
  Type type_local;
  char *local_8;
  
  switch(type) {
  case NULL_TYPE:
    local_8 = "null";
    break;
  case BOOL_TYPE:
    local_8 = "bool";
    break;
  case INT_TYPE:
    local_8 = "int";
    break;
  case DOUBLE_TYPE:
    local_8 = "double";
    break;
  case STRING_TYPE:
    local_8 = "string";
    break;
  case TIME_TYPE:
    local_8 = "time";
    break;
  case ARRAY_TYPE:
    local_8 = "array";
    break;
  case TABLE_TYPE:
    local_8 = "table";
    break;
  default:
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

inline const char* Value::typeToString(Value::Type type)
{
    switch (type) {
    case NULL_TYPE:   return "null";
    case BOOL_TYPE:   return "bool";
    case INT_TYPE:    return "int";
    case DOUBLE_TYPE: return "double";
    case STRING_TYPE: return "string";
    case TIME_TYPE:   return "time";
    case ARRAY_TYPE:  return "array";
    case TABLE_TYPE:  return "table";
    default:          return "unknown";
    }
}